

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyCore.cpp
# Opt level: O0

string * helics::quickCoreQueries_abi_cxx11_(string_view queryStr)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  bool bVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffde0;
  size_t in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  string *__a;
  char *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe28;
  JsonErrorCodes in_stack_fffffffffffffe34;
  allocator<char> local_161 [17];
  undefined8 local_150;
  undefined8 local_148;
  allocator<char> local_139 [81];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_c8;
  undefined8 local_c0;
  allocator<char> local_b1 [17];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_80;
  undefined8 local_78;
  allocator<char> local_59 [17];
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_18;
  undefined8 local_10;
  
  __a = in_RDI;
  local_18 = in_RSI;
  local_10 = in_RDX;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
  __x._M_str = (char *)__a;
  __x._M_len = (size_t)in_RDI;
  __y._M_str = in_stack_fffffffffffffdf0;
  __y._M_len = in_stack_fffffffffffffde8;
  bVar1 = std::operator==(__x,__y);
  if (!bVar1) {
    local_48 = local_18;
    local_40 = local_10;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
    __x_00._M_str = (char *)__a;
    __x_00._M_len = (size_t)in_RDI;
    __y_00._M_str = in_stack_fffffffffffffdf0;
    __y_00._M_len = in_stack_fffffffffffffde8;
    bVar1 = std::operator==(__x_00,__y_00);
    if (!bVar1) {
      local_80 = local_18;
      local_78 = local_10;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
      __x_01._M_str = (char *)__a;
      __x_01._M_len = (size_t)in_RDI;
      __y_01._M_str = in_stack_fffffffffffffdf0;
      __y_01._M_len = in_stack_fffffffffffffde8;
      bVar1 = std::operator==(__x_01,__y_01);
      if (!bVar1) {
        local_a0 = local_18;
        local_98 = local_10;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
        __x_02._M_str = (char *)__a;
        __x_02._M_len = (size_t)in_RDI;
        __y_02._M_str = in_stack_fffffffffffffdf0;
        __y_02._M_len = in_stack_fffffffffffffde8;
        bVar1 = std::operator==(__x_02,__y_02);
        if (!bVar1) {
          local_c8 = local_18;
          local_c0 = local_10;
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
          __x_03._M_str = (char *)__a;
          __x_03._M_len = (size_t)in_RDI;
          __y_03._M_str = in_stack_fffffffffffffdf0;
          __y_03._M_len = in_stack_fffffffffffffde8;
          bVar1 = std::operator==(__x_03,__y_03);
          if (!bVar1) {
            local_e8 = local_18;
            local_e0 = local_10;
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
            __x_04._M_str = (char *)__a;
            __x_04._M_len = (size_t)in_RDI;
            __y_04._M_str = in_stack_fffffffffffffdf0;
            __y_04._M_len = in_stack_fffffffffffffde8;
            bVar1 = std::operator==(__x_04,__y_04);
            if (!bVar1) {
              local_150 = local_18;
              local_148 = local_10;
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
              __x_05._M_str = (char *)__a;
              __x_05._M_len = (size_t)in_RDI;
              __y_05._M_str = in_stack_fffffffffffffdf0;
              __y_05._M_len = in_stack_fffffffffffffde8;
              bVar1 = std::operator==(__x_05,__y_05);
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                           (allocator<char> *)__a);
                std::allocator<char>::~allocator(local_161);
                return __a;
              }
              CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
              __x_06._M_str = (char *)__a;
              __x_06._M_len = (size_t)in_RDI;
              __y_06._M_str = in_stack_fffffffffffffdf0;
              __y_06._M_len = in_stack_fffffffffffffde8;
              bVar1 = std::operator==(__x_06,__y_06);
              if (!bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                           (allocator<char> *)__a);
                generateJsonErrorResponse(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
                std::__cxx11::string::~string(in_stack_fffffffffffffdd0);
                std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe0f);
                return __a;
              }
              this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffe37;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(allocator<char> *)__a)
              ;
              std::operator+(in_stack_fffffffffffffdd8,(char *)this);
              std::operator+(in_stack_fffffffffffffdd8,(char)((ulong)this >> 0x38));
              std::__cxx11::string::~string(this);
              std::__cxx11::string::~string(this);
              std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
              return __a;
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(allocator<char> *)__a);
          std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
          std::operator+(in_stack_fffffffffffffdd8,(char)((ulong)in_stack_fffffffffffffdd0 >> 0x38))
          ;
          std::__cxx11::string::~string(in_stack_fffffffffffffdd0);
          std::__cxx11::string::~string(in_stack_fffffffffffffdd0);
          std::allocator<char>::~allocator(local_139);
          return __a;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(allocator<char> *)__a);
      std::allocator<char>::~allocator(local_b1);
      return __a;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(allocator<char> *)__a);
  std::allocator<char>::~allocator(local_59);
  return __a;
}

Assistant:

static std::string quickCoreQueries(std::string_view queryStr)
{
    if ((queryStr == "queries") || (queryStr == "available_queries")) {
        return "[\"isinit\",\"isconnected\",\"exists\",\"name\",\"identifier\",\"address\",\"queries\",\"address\",\"federates\",\"inputs\",\"endpoints\",\"filtered_endpoints\","
               "\"publications\",\"filters\",\"tags\",\"version\",\"version_all\",\"federate_map\",\"dependency_graph\",\"data_flow_graph\",\"dependencies\",\"dependson\",\"dependents\",\"current_time\",\"global_time\",\"global_state\",\"global_flush\",\"current_state\"]";
    }
    if (queryStr == "isconnected" || queryStr == "isinit") {
        return "false";
    }
    if (queryStr == "name" || queryStr == "identifier") {
        return std::string{"\""} + "null" + '"';
    }
    if (queryStr == "exists") {
        return "true";
    }
    if (queryStr == "version") {
        return std::string{"\""} + versionString + '"';
    }
    return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Core is disconnected");
}